

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

InsertionResult * __thiscall
QHashPrivate::Data<QHashPrivate::Node<ProKey,_ProKey>_>::findOrInsert<ProKey>
          (InsertionResult *__return_storage_ptr__,Data<QHashPrivate::Node<ProKey,_ProKey>_> *this,
          ProKey *key)

{
  size_t sVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  Bucket local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (Bucket)ZEXT816(0);
  uVar4 = this->seed;
  sVar1 = qHash(&key->super_ProString);
  uVar4 = sVar1 ^ uVar4;
  if (this->numBuckets == 0) {
    uVar3 = this->size;
LAB_001fe607:
    rehash(this,uVar3 + 1);
    local_48 = findBucketWithHash<ProKey>(this,key,uVar4);
  }
  else {
    local_48 = findBucketWithHash<ProKey>(this,key,uVar4);
    if ((local_48.span)->offsets[local_48.index] != 0xff) {
      uVar4 = ((long)local_48.span - (long)this->spans) / 0x90 << 7 | local_48.index;
      bVar2 = true;
      goto LAB_001fe653;
    }
    uVar3 = this->size;
    if (this->numBuckets >> 1 <= uVar3) goto LAB_001fe607;
  }
  Bucket::insert(&local_48);
  this->size = this->size + 1;
  uVar4 = ((long)local_48.span - (long)this->spans) / 0x90 << 7 | local_48.index;
  bVar2 = false;
LAB_001fe653:
  (__return_storage_ptr__->it).d = this;
  (__return_storage_ptr__->it).bucket = uVar4;
  __return_storage_ptr__->initialized = bVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

InsertionResult findOrInsert(const K &key) noexcept
    {
        Bucket it(static_cast<Span *>(nullptr), 0);
        size_t hash = QHashPrivate::calculateHash(key, seed);
        if (numBuckets > 0) {
            it = findBucketWithHash(key, hash);
            if (!it.isUnused())
                return { it.toIterator(this), true };
        }
        if (shouldGrow()) {
            rehash(size + 1);
            it = findBucketWithHash(key, hash); // need to get a new iterator after rehashing
        }
        Q_ASSERT(it.span != nullptr);
        Q_ASSERT(it.isUnused());
        it.insert();
        ++size;
        return { it.toIterator(this), false };
    }